

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O2

int GaussPlane_F32(float *src,int src_stride,float *dst,int dst_stride,int width,int height)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  ulong uVar3;
  float *pfVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  void *__ptr;
  float *src2;
  float *src1;
  float *src0;
  float *src4;
  int iVar8;
  undefined8 *puVar9;
  bool bVar10;
  
  if ((height == 0 || width < 1) || (dst == (float *)0x0 || src == (float *)0x0)) {
    iVar5 = -1;
  }
  else {
    if (height < 0) {
      src = src + ~height * src_stride;
      src_stride = -src_stride;
      height = -height;
    }
    __ptr = malloc((ulong)(width * 4 + 0x5f));
    puVar9 = (undefined8 *)((long)__ptr + 0x3fU & 0xffffffffffffffc0);
    *puVar9 = 0;
    puVar9[1] = 0;
    puVar1 = (undefined8 *)((long)puVar9 + (ulong)(width * 4 + 0x10));
    *puVar1 = 0;
    puVar1[1] = 0;
    iVar8 = 0;
    iVar5 = 0;
    if (1 < (uint)height) {
      iVar5 = src_stride;
    }
    iVar6 = 0;
    if (2 < (uint)height) {
      iVar6 = src_stride;
    }
    uVar3 = (ulong)(uint)width;
    iVar7 = height - 1;
    pfVar4 = src + iVar5;
    src2 = src;
    src0 = src;
    src4 = src + iVar5 + iVar6;
    while (src1 = src2, src2 = src, src = pfVar4, bVar10 = height != 0, height = height - 1, bVar10)
    {
      GaussCol_F32_C(src0,src1,src2,src,src4,(float *)(puVar9 + 2),width);
      *(undefined4 *)((long)puVar9 + 0xc) = *(undefined4 *)(puVar9 + 2);
      *(undefined4 *)(puVar9 + 1) = *(undefined4 *)(puVar9 + 2);
      uVar2 = *(undefined4 *)((long)puVar9 + uVar3 * 4 + 0xc);
      *(undefined4 *)((long)puVar9 + uVar3 * 4 + 0x10) = uVar2;
      *(undefined4 *)((long)puVar9 + uVar3 * 4 + 0x14) = uVar2;
      GaussRow_F32_C((float *)(puVar9 + 1),dst,width);
      iVar5 = 0;
      if (iVar8 + 2 < iVar7) {
        iVar5 = src_stride;
      }
      iVar8 = iVar8 + 1;
      dst = dst + dst_stride;
      pfVar4 = src4;
      src0 = src1;
      src4 = src4 + iVar5;
    }
    free(__ptr);
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

LIBYUV_API
int GaussPlane_F32(const float* src,
                   int src_stride,
                   float* dst,
                   int dst_stride,
                   int width,
                   int height) {
  int y;
  void (*GaussCol_F32)(const float* src0, const float* src1, const float* src2,
                       const float* src3, const float* src4, float* dst,
                       int width) = GaussCol_F32_C;
  void (*GaussRow_F32)(const float* src, float* dst, int width) =
      GaussRow_F32_C;
  if (!src || !dst || width <= 0 || height == 0) {
    return -1;
  }
  // Negative height means invert the image.
  if (height < 0) {
    height = -height;
    src = src + (height - 1) * src_stride;
    src_stride = -src_stride;
  }

#if defined(HAS_GAUSSCOL_F32_NEON)
  if (TestCpuFlag(kCpuHasNEON) && IS_ALIGNED(width, 8)) {
    GaussCol_F32 = GaussCol_F32_NEON;
  }
#endif
#if defined(HAS_GAUSSROW_F32_NEON)
  if (TestCpuFlag(kCpuHasNEON) && IS_ALIGNED(width, 8)) {
    GaussRow_F32 = GaussRow_F32_NEON;
  }
#endif
  {
    // 2 pixels on each side, but aligned out to 16 bytes.
    align_buffer_64(rowbuf, (4 + width + 4) * 4);
    memset(rowbuf, 0, 16);
    memset(rowbuf + (4 + width) * 4, 0, 16);
    float* row = (float*)(rowbuf + 16);
    const float* src0 = src;
    const float* src1 = src;
    const float* src2 = src;
    const float* src3 = src2 + ((height > 1) ? src_stride : 0);
    const float* src4 = src3 + ((height > 2) ? src_stride : 0);

    for (y = 0; y < height; ++y) {
      GaussCol_F32(src0, src1, src2, src3, src4, row, width);

      // Extrude edge by 2 floats
      row[-2] = row[-1] = row[0];
      row[width + 1] = row[width] = row[width - 1];

      GaussRow_F32(row - 2, dst, width);

      src0 = src1;
      src1 = src2;
      src2 = src3;
      src3 = src4;
      if ((y + 2) < (height - 1)) {
        src4 += src_stride;
      }
      dst += dst_stride;
    }
    free_aligned_buffer_64(rowbuf);
  }
  return 0;
}